

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_MainWindow.h
# Opt level: O0

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  QMainWindow *pQVar1;
  bool bVar2;
  QAction *pQVar3;
  QWidget *pQVar4;
  QHBoxLayout *pQVar5;
  QTabWidget *pQVar6;
  QGroupBox *pQVar7;
  QGridLayout *pQVar8;
  QLabel *pQVar9;
  QTextBrowser *pQVar10;
  QPushButton *pQVar11;
  QWidget *pQVar12;
  QVBoxLayout *pQVar13;
  QDoubleSpinBox *pQVar14;
  QSlider *pQVar15;
  QSpacerItem *pQVar16;
  TargetImageWidget *pTVar17;
  QComboBox *pQVar18;
  AllRgbWidget *pAVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  QByteArrayView QVar46;
  QByteArrayView QVar47;
  QByteArrayView QVar48;
  QByteArrayView QVar49;
  QByteArrayView QVar50;
  QByteArrayView QVar51;
  QByteArrayView QVar52;
  QByteArrayView QVar53;
  QByteArrayView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QByteArrayView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QByteArrayView QVar60;
  QByteArrayView QVar61;
  QByteArrayView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QByteArrayView QVar65;
  QByteArrayView QVar66;
  QByteArrayView QVar67;
  QByteArrayView QVar68;
  QByteArrayView QVar69;
  QFlags<Qt::AlignmentFlag> local_9b4;
  QString local_9b0;
  QFlags<Qt::AlignmentFlag> local_994;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_990;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_98c;
  QByteArrayView local_988;
  QString local_978;
  QFlags<Qt::AlignmentFlag> local_960;
  QFlags<Qt::AlignmentFlag> local_95c;
  QFlags<Qt::AlignmentFlag> local_958;
  Int local_954;
  QByteArrayView local_950;
  QString local_940;
  QFlags<Qt::WindowType> local_928;
  QFlags<Qt::AlignmentFlag> local_924;
  QByteArrayView local_920;
  QString local_910;
  QFlags<Qt::AlignmentFlag> local_8f4;
  QFlags<Qt::AlignmentFlag> local_8f0;
  Int local_8ec;
  QByteArrayView local_8e8;
  QString local_8d8;
  QFlags<Qt::WindowType> local_8c0;
  QFlags<Qt::AlignmentFlag> local_8bc;
  QByteArrayView local_8b8;
  QString local_8a8;
  QFlags<Qt::AlignmentFlag> local_88c;
  QByteArrayView local_888;
  QString local_878;
  QFlags<Qt::AlignmentFlag> local_85c;
  QFlags<Qt::AlignmentFlag> local_858;
  Int local_854;
  QByteArrayView local_850;
  QString local_840;
  QFlags<Qt::WindowType> local_828;
  QFlags<Qt::AlignmentFlag> local_824;
  QByteArrayView local_820;
  QString local_810;
  QFlags<Qt::AlignmentFlag> local_7f4;
  QByteArrayView local_7f0;
  QString local_7e0;
  QFlags<Qt::AlignmentFlag> local_7c4;
  QByteArrayView local_7c0;
  QString local_7b0;
  QFlags<Qt::AlignmentFlag> local_798;
  QFlags<Qt::AlignmentFlag> local_794;
  QFlags<Qt::AlignmentFlag> local_790;
  Int local_78c;
  QByteArrayView local_788;
  QString local_778;
  QFlags<Qt::WindowType> local_760;
  QFlags<Qt::AlignmentFlag> local_75c;
  QByteArrayView local_758;
  QString local_748;
  QFlags<Qt::AlignmentFlag> local_72c;
  QByteArrayView local_728;
  QString local_718;
  QFlags<Qt::AlignmentFlag> local_6fc;
  QByteArrayView local_6f8;
  QString local_6e8;
  QFlags<Qt::AlignmentFlag> local_6cc;
  QByteArrayView local_6c8;
  QString local_6b8;
  QFlags<Qt::AlignmentFlag> local_69c;
  QFlags<Qt::AlignmentFlag> local_698;
  Int local_694;
  QByteArrayView local_690;
  QString local_680;
  QFlags<Qt::WindowType> local_664;
  QByteArrayView local_660;
  QString local_650;
  QByteArrayView local_638;
  QString local_628;
  QByteArrayView local_610;
  QString local_600;
  QByteArrayView local_5e8;
  QString local_5d8;
  QFlags<Qt::WindowType> local_5bc;
  QString local_5b8;
  QFlags<Qt::AlignmentFlag> local_5a0;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_59c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_598;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_594;
  undefined1 auStack_590 [4];
  QSizePolicy sizePolicy1;
  QString local_580;
  QFlags<Qt::AlignmentFlag> local_568;
  QFlags<Qt::AlignmentFlag> local_564;
  QByteArrayView local_560;
  QString local_550;
  QFlags<Qt::AlignmentFlag> local_538;
  QFlags<Qt::AlignmentFlag> local_534;
  QByteArrayView local_530;
  QString local_520;
  QFlags<Qt::AlignmentFlag> local_504;
  QByteArrayView local_500;
  QString local_4f0;
  QFlags<Qt::AlignmentFlag> local_4d4;
  QByteArrayView local_4d0;
  QString local_4c0;
  QFlags<Qt::AlignmentFlag> local_4a4;
  QByteArrayView local_4a0;
  QString local_490;
  QFlags<Qt::AlignmentFlag> local_474;
  QByteArrayView local_470;
  QString local_460;
  QFlags<Qt::AlignmentFlag> local_448;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_444;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_440;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_43c;
  undefined1 auStack_438 [4];
  QSizePolicy sizePolicy;
  QString local_428;
  QFlags<Qt::AlignmentFlag> local_40c;
  QByteArrayView local_408;
  QString local_3f8;
  QFlags<Qt::WindowType> local_3e0;
  QFlags<Qt::AlignmentFlag> local_3dc;
  QByteArrayView local_3d8;
  QString local_3c8;
  QFlags<Qt::WindowType> local_3b0;
  QFlags<Qt::AlignmentFlag> local_3ac;
  QByteArrayView local_3a8;
  QString local_398;
  QFlags<Qt::AlignmentFlag> local_380;
  QFlags<Qt::AlignmentFlag> local_37c;
  QByteArrayView local_378;
  QString local_368;
  QFlags<Qt::AlignmentFlag> local_34c;
  QByteArrayView local_348;
  QString local_338;
  QByteArrayView local_320;
  QString local_310;
  QByteArrayView local_2f8;
  QString local_2e8;
  QFlags<Qt::WindowType> local_2d0;
  QFlags<Qt::AlignmentFlag> local_2cc;
  QByteArrayView local_2c8;
  QString local_2b8;
  QFlags<Qt::AlignmentFlag> local_29c;
  QByteArrayView local_298;
  QString local_288;
  QFlags<Qt::AlignmentFlag> local_26c;
  QByteArrayView local_268;
  QString local_258;
  QFlags<Qt::AlignmentFlag> local_23c;
  QByteArrayView local_238;
  QString local_228;
  QFlags<Qt::WindowType> local_20c;
  QByteArrayView local_208;
  QString local_1f8;
  QByteArrayView local_1e0;
  QString local_1d0;
  QByteArrayView local_1b8;
  QString local_1a8;
  QByteArrayView local_190;
  QString local_180;
  QFlags<Qt::WindowType> local_164;
  QByteArrayView local_160;
  QString local_150;
  QByteArrayView local_138;
  QString local_128;
  QByteArrayView local_110;
  QString local_100;
  QFlags<Qt::WindowType> local_e4;
  QByteArrayView local_e0;
  QString local_d0;
  QByteArrayView local_b8;
  QString local_a8;
  QByteArrayView local_90;
  QString local_80;
  QByteArrayView local_68;
  QString local_58;
  QString local_30;
  QMainWindow *local_18;
  QMainWindow *MainWindow_local;
  Ui_MainWindow *this_local;
  
  local_18 = MainWindow;
  MainWindow_local = (QMainWindow *)this;
  QObject::objectName();
  bVar2 = QString::isEmpty(&local_30);
  QString::~QString(&local_30);
  pQVar1 = local_18;
  if (bVar2) {
    QByteArrayView::QByteArrayView<11ul>(&local_68,(char (*) [11])"MainWindow");
    QVar20.m_data = (storage_type *)local_68.m_size;
    QVar20.m_size = (qsizetype)&local_58;
    QString::fromUtf8(QVar20);
    QObject::setObjectName((QString *)pQVar1);
    QString::~QString(&local_58);
  }
  QWidget::resize((QWidget *)local_18,0x4b2,0x318);
  pQVar3 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar3,(QObject *)local_18);
  this->actionNew = pQVar3;
  pQVar3 = this->actionNew;
  QByteArrayView::QByteArrayView<10ul>(&local_90,(char (*) [10])"actionNew");
  QVar21.m_data = (storage_type *)local_90.m_size;
  QVar21.m_size = (qsizetype)&local_80;
  QString::fromUtf8(QVar21);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_80);
  pQVar3 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar3,(QObject *)local_18);
  this->actionLoad = pQVar3;
  pQVar3 = this->actionLoad;
  QByteArrayView::QByteArrayView<11ul>(&local_b8,(char (*) [11])"actionLoad");
  QVar22.m_data = (storage_type *)local_b8.m_size;
  QVar22.m_size = (qsizetype)&local_a8;
  QString::fromUtf8(QVar22);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_a8);
  pQVar3 = (QAction *)operator_new(0x10);
  QAction::QAction(pQVar3,(QObject *)local_18);
  this->actionSave = pQVar3;
  pQVar3 = this->actionSave;
  QByteArrayView::QByteArrayView<11ul>(&local_e0,(char (*) [11])"actionSave");
  QVar23.m_data = (storage_type *)local_e0.m_size;
  QVar23.m_size = (qsizetype)&local_d0;
  QString::fromUtf8(QVar23);
  QObject::setObjectName((QString *)pQVar3);
  QString::~QString(&local_d0);
  pQVar4 = (QWidget *)operator_new(0x28);
  pQVar1 = local_18;
  QFlags<Qt::WindowType>::QFlags(&local_e4);
  QWidget::QWidget(pQVar4,(QWidget *)pQVar1,(QFlags_conflict1 *)(ulong)local_e4.i);
  this->centralwidget = pQVar4;
  pQVar4 = this->centralwidget;
  QByteArrayView::QByteArrayView<14ul>(&local_110,(char (*) [14])"centralwidget");
  QVar24.m_data = (storage_type *)local_110.m_size;
  QVar24.m_size = (qsizetype)&local_100;
  QString::fromUtf8(QVar24);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_100);
  pQVar5 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar5,this->centralwidget);
  this->horizontalLayout = pQVar5;
  pQVar5 = this->horizontalLayout;
  QByteArrayView::QByteArrayView<17ul>(&local_138,(char (*) [17])"horizontalLayout");
  QVar25.m_data = (storage_type *)local_138.m_size;
  QVar25.m_size = (qsizetype)&local_128;
  QString::fromUtf8(QVar25);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_128);
  pQVar6 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(pQVar6,this->centralwidget);
  this->tabWidget = pQVar6;
  pQVar6 = this->tabWidget;
  QByteArrayView::QByteArrayView<10ul>(&local_160,(char (*) [10])"tabWidget");
  QVar26.m_data = (storage_type *)local_160.m_size;
  QVar26.m_size = (qsizetype)&local_150;
  QString::fromUtf8(QVar26);
  QObject::setObjectName((QString *)pQVar6);
  QString::~QString(&local_150);
  pQVar4 = (QWidget *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags(&local_164);
  QWidget::QWidget(pQVar4,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_164.i);
  this->loadImageTab = pQVar4;
  pQVar4 = this->loadImageTab;
  QByteArrayView::QByteArrayView<13ul>(&local_190,(char (*) [13])"loadImageTab");
  QVar27.m_data = (storage_type *)local_190.m_size;
  QVar27.m_size = (qsizetype)&local_180;
  QString::fromUtf8(QVar27);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_180);
  pQVar5 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar5,this->loadImageTab);
  this->horizontalLayout_2 = pQVar5;
  pQVar5 = this->horizontalLayout_2;
  QByteArrayView::QByteArrayView<19ul>(&local_1b8,(char (*) [19])"horizontalLayout_2");
  QVar28.m_data = (storage_type *)local_1b8.m_size;
  QVar28.m_size = (qsizetype)&local_1a8;
  QString::fromUtf8(QVar28);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_1a8);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(pQVar7,this->loadImageTab);
  this->groupBox = pQVar7;
  pQVar7 = this->groupBox;
  QByteArrayView::QByteArrayView<9ul>(&local_1e0,(char (*) [9])"groupBox");
  QVar29.m_data = (storage_type *)local_1e0.m_size;
  QVar29.m_size = (qsizetype)&local_1d0;
  QString::fromUtf8(QVar29);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_1d0);
  pQVar8 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar8,(QWidget *)this->groupBox);
  this->gridLayout = pQVar8;
  pQVar8 = this->gridLayout;
  QByteArrayView::QByteArrayView<11ul>(&local_208,(char (*) [11])"gridLayout");
  QVar30.m_data = (storage_type *)local_208.m_size;
  QVar30.m_size = (qsizetype)&local_1f8;
  QString::fromUtf8(QVar30);
  QObject::setObjectName((QString *)pQVar8);
  QString::~QString(&local_1f8);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->groupBox;
  QFlags<Qt::WindowType>::QFlags(&local_20c);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_20c.i);
  this->targetImageScaleLabel = pQVar9;
  pQVar9 = this->targetImageScaleLabel;
  QByteArrayView::QByteArrayView<22ul>(&local_238,(char (*) [22])"targetImageScaleLabel");
  QVar31.m_data = (storage_type *)local_238.m_size;
  QVar31.m_size = (qsizetype)&local_228;
  QString::fromUtf8(QVar31);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_228);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar9 = this->targetImageScaleLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_23c);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,3,0,1,(QFlags_conflict1 *)0x1);
  pQVar10 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(pQVar10,(QWidget *)this->groupBox);
  this->explanationText = pQVar10;
  pQVar10 = this->explanationText;
  QByteArrayView::QByteArrayView<16ul>(&local_268,(char (*) [16])"explanationText");
  QVar32.m_data = (storage_type *)local_268.m_size;
  QVar32.m_size = (qsizetype)&local_258;
  QString::fromUtf8(QVar32);
  QObject::setObjectName((QString *)pQVar10);
  QString::~QString(&local_258);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar10 = this->explanationText;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_26c);
  QGridLayout::addWidget(pQVar4,(int)pQVar10,0,0,1,(QFlags_conflict1 *)0x3);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->targetImageRotate90DegreesButton = pQVar11;
  pQVar11 = this->targetImageRotate90DegreesButton;
  QByteArrayView::QByteArrayView<33ul>(&local_298,(char (*) [33])"targetImageRotate90DegreesButton")
  ;
  QVar33.m_data = (storage_type *)local_298.m_size;
  QVar33.m_size = (qsizetype)&local_288;
  QString::fromUtf8(QVar33);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_288);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->targetImageRotate90DegreesButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_29c);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,2,2,1,(QFlags_conflict1 *)0x1);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->targetImageLoadButton = pQVar11;
  pQVar11 = this->targetImageLoadButton;
  QByteArrayView::QByteArrayView<22ul>(&local_2c8,(char (*) [22])"targetImageLoadButton");
  QVar34.m_data = (storage_type *)local_2c8.m_size;
  QVar34.m_size = (qsizetype)&local_2b8;
  QString::fromUtf8(QVar34);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_2b8);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->targetImageLoadButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_2cc);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,1,0,1,(QFlags_conflict1 *)0x3);
  pQVar12 = (QWidget *)operator_new(0x28);
  pQVar4 = (QWidget *)this->groupBox;
  QFlags<Qt::WindowType>::QFlags(&local_2d0);
  QWidget::QWidget(pQVar12,pQVar4,(QFlags_conflict1 *)(ulong)local_2d0.i);
  this->widget = pQVar12;
  pQVar4 = this->widget;
  QByteArrayView::QByteArrayView<7ul>(&local_2f8,(char (*) [7])0x1268c4);
  QVar35.m_data = (storage_type *)local_2f8.m_size;
  QVar35.m_size = (qsizetype)&local_2e8;
  QString::fromUtf8(QVar35);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_2e8);
  pQVar13 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar13,this->widget);
  this->verticalLayout = pQVar13;
  pQVar13 = this->verticalLayout;
  QByteArrayView::QByteArrayView<15ul>(&local_320,(char (*) [15])"verticalLayout");
  QVar36.m_data = (storage_type *)local_320.m_size;
  QVar36.m_size = (qsizetype)&local_310;
  QString::fromUtf8(QVar36);
  QObject::setObjectName((QString *)pQVar13);
  QString::~QString(&local_310);
  QLayout::setContentsMargins((int)this->verticalLayout,0,0,0);
  pQVar14 = (QDoubleSpinBox *)operator_new(0x28);
  QDoubleSpinBox::QDoubleSpinBox(pQVar14,this->widget);
  this->targetImageXOffsetSpinBox = pQVar14;
  pQVar14 = this->targetImageXOffsetSpinBox;
  QByteArrayView::QByteArrayView<26ul>(&local_348,(char (*) [26])"targetImageXOffsetSpinBox");
  QVar37.m_data = (storage_type *)local_348.m_size;
  QVar37.m_size = (qsizetype)&local_338;
  QString::fromUtf8(QVar37);
  QObject::setObjectName((QString *)pQVar14);
  QString::~QString(&local_338);
  QDoubleSpinBox::setMinimum(-4096.0);
  QDoubleSpinBox::setMaximum(4096.0);
  pQVar4 = (QWidget *)this->verticalLayout;
  pQVar14 = this->targetImageXOffsetSpinBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_34c);
  QBoxLayout::addWidget(pQVar4,(int)pQVar14,(QFlags_conflict1 *)0x0);
  pQVar14 = (QDoubleSpinBox *)operator_new(0x28);
  QDoubleSpinBox::QDoubleSpinBox(pQVar14,this->widget);
  this->targetImageYOffsetSpinBox = pQVar14;
  pQVar14 = this->targetImageYOffsetSpinBox;
  QByteArrayView::QByteArrayView<26ul>(&local_378,(char (*) [26])"targetImageYOffsetSpinBox");
  QVar38.m_data = (storage_type *)local_378.m_size;
  QVar38.m_size = (qsizetype)&local_368;
  QString::fromUtf8(QVar38);
  QObject::setObjectName((QString *)pQVar14);
  QString::~QString(&local_368);
  QDoubleSpinBox::setMinimum(-4096.0);
  QDoubleSpinBox::setMaximum(4096.0);
  pQVar4 = (QWidget *)this->verticalLayout;
  pQVar14 = this->targetImageYOffsetSpinBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_37c);
  QBoxLayout::addWidget(pQVar4,(int)pQVar14,(QFlags_conflict1 *)0x0);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar12 = this->widget;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_380);
  QGridLayout::addWidget(pQVar4,(int)pQVar12,4,1,2,(QFlags_conflict1 *)0x1);
  pQVar14 = (QDoubleSpinBox *)operator_new(0x28);
  QDoubleSpinBox::QDoubleSpinBox(pQVar14,(QWidget *)this->groupBox);
  this->targetImageScaleSpinBox = pQVar14;
  pQVar14 = this->targetImageScaleSpinBox;
  QByteArrayView::QByteArrayView<24ul>(&local_3a8,(char (*) [24])"targetImageScaleSpinBox");
  QVar39.m_data = (storage_type *)local_3a8.m_size;
  QVar39.m_size = (qsizetype)&local_398;
  QString::fromUtf8(QVar39);
  QObject::setObjectName((QString *)pQVar14);
  QString::~QString(&local_398);
  QDoubleSpinBox::setDecimals((int)this->targetImageScaleSpinBox);
  QDoubleSpinBox::setMinimum(0.01);
  QDoubleSpinBox::setMaximum(10.0);
  QDoubleSpinBox::setSingleStep(1.0);
  QDoubleSpinBox::setStepType((StepType)this->targetImageScaleSpinBox);
  QDoubleSpinBox::setValue(1.0);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar14 = this->targetImageScaleSpinBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_3ac);
  QGridLayout::addWidget(pQVar4,(int)pQVar14,3,1,1,(QFlags_conflict1 *)0x1);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->groupBox;
  QFlags<Qt::WindowType>::QFlags(&local_3b0);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_3b0.i);
  this->targetImageOffsetLabel = pQVar9;
  pQVar9 = this->targetImageOffsetLabel;
  QByteArrayView::QByteArrayView<23ul>(&local_3d8,(char (*) [23])"targetImageOffsetLabel");
  QVar40.m_data = (storage_type *)local_3d8.m_size;
  QVar40.m_size = (qsizetype)&local_3c8;
  QString::fromUtf8(QVar40);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_3c8);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar9 = this->targetImageOffsetLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_3dc);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,4,0,2,(QFlags_conflict1 *)0x1);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->groupBox;
  QFlags<Qt::WindowType>::QFlags(&local_3e0);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_3e0.i);
  this->targetImageRotationLabel = pQVar9;
  pQVar9 = this->targetImageRotationLabel;
  QByteArrayView::QByteArrayView<25ul>(&local_408,(char (*) [25])"targetImageRotationLabel");
  QVar41.m_data = (storage_type *)local_408.m_size;
  QVar41.m_size = (qsizetype)&local_3f8;
  QString::fromUtf8(QVar41);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_3f8);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar9 = this->targetImageRotationLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_40c);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,2,0,1,(QFlags_conflict1 *)0x1);
  pQVar15 = (QSlider *)operator_new(0x28);
  QSlider::QSlider(pQVar15,(QWidget *)this->groupBox);
  this->targetImageRotationSlider = pQVar15;
  pQVar15 = this->targetImageRotationSlider;
  QByteArrayView::QByteArrayView<26ul>
            ((QByteArrayView *)auStack_438,(char (*) [26])"targetImageRotationSlider");
  QVar42.m_data = _auStack_438;
  QVar42.m_size = (qsizetype)&local_428;
  QString::fromUtf8(QVar42);
  QObject::setObjectName((QString *)pQVar15);
  QString::~QString(&local_428);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_43c.bits,Preferred,Fixed,DefaultType);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)&local_43c.bits,0);
  QSizePolicy::setVerticalStretch((QSizePolicy *)&local_43c.bits,0);
  local_440.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_440.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_43c.bits,bVar2);
  local_444 = local_43c;
  QWidget::setSizePolicy((QSizePolicy *)this->targetImageRotationSlider);
  QAbstractSlider::setMaximum((int)this->targetImageRotationSlider);
  QAbstractSlider::setOrientation((Orientation)this->targetImageRotationSlider);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar15 = this->targetImageRotationSlider;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_448);
  QGridLayout::addWidget(pQVar4,(int)pQVar15,2,1,1,(QFlags_conflict1 *)0x1);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->targetImagePreviewButton = pQVar11;
  pQVar11 = this->targetImagePreviewButton;
  QByteArrayView::QByteArrayView<25ul>(&local_470,(char (*) [25])"targetImagePreviewButton");
  QVar43.m_data = (storage_type *)local_470.m_size;
  QVar43.m_size = (qsizetype)&local_460;
  QString::fromUtf8(QVar43);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_460);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->targetImagePreviewButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_474);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,6,0,1,(QFlags_conflict1 *)0x3);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->targetImageResetTranslationButton = pQVar11;
  pQVar11 = this->targetImageResetTranslationButton;
  QByteArrayView::QByteArrayView<34ul>
            (&local_4a0,(char (*) [34])"targetImageResetTranslationButton");
  QVar44.m_data = (storage_type *)local_4a0.m_size;
  QVar44.m_size = (qsizetype)&local_490;
  QString::fromUtf8(QVar44);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_490);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->targetImageResetTranslationButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_4a4);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,4,2,2,(QFlags_conflict1 *)0x1);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->setTargetImageButton = pQVar11;
  pQVar11 = this->setTargetImageButton;
  QByteArrayView::QByteArrayView<21ul>(&local_4d0,(char (*) [21])"setTargetImageButton");
  QVar45.m_data = (storage_type *)local_4d0.m_size;
  QVar45.m_size = (qsizetype)&local_4c0;
  QString::fromUtf8(QVar45);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_4c0);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->setTargetImageButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_4d4);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,8,0,1,(QFlags_conflict1 *)0x3);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->moreByTroyDevButton = pQVar11;
  pQVar11 = this->moreByTroyDevButton;
  QByteArrayView::QByteArrayView<20ul>(&local_500,(char (*) [20])"moreByTroyDevButton");
  QVar46.m_data = (storage_type *)local_500.m_size;
  QVar46.m_size = (qsizetype)&local_4f0;
  QString::fromUtf8(QVar46);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_4f0);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->moreByTroyDevButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_504);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,10,0,1,(QFlags_conflict1 *)0x3);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->targetImageFitToAreaButton = pQVar11;
  pQVar11 = this->targetImageFitToAreaButton;
  QByteArrayView::QByteArrayView<27ul>(&local_530,(char (*) [27])"targetImageFitToAreaButton");
  QVar47.m_data = (storage_type *)local_530.m_size;
  QVar47.m_size = (qsizetype)&local_520;
  QString::fromUtf8(QVar47);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_520);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->targetImageFitToAreaButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_534);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,3,2,1,(QFlags_conflict1 *)0x1);
  pQVar16 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar16,0x14,0x28,Minimum,Expanding);
  this->targetImageOptionsSpacer = pQVar16;
  pQVar8 = this->gridLayout;
  pQVar16 = this->targetImageOptionsSpacer;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_538);
  QGridLayout::addItem((QLayoutItem *)pQVar8,(int)pQVar16,9,0,1,(QFlags_conflict1 *)0x3);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->groupBox);
  this->targetImageSaveButton = pQVar11;
  pQVar11 = this->targetImageSaveButton;
  QByteArrayView::QByteArrayView<22ul>(&local_560,(char (*) [22])"targetImageSaveButton");
  QVar48.m_data = (storage_type *)local_560.m_size;
  QVar48.m_size = (qsizetype)&local_550;
  QString::fromUtf8(QVar48);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_550);
  pQVar4 = (QWidget *)this->gridLayout;
  pQVar11 = this->targetImageSaveButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_564);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,7,0,1,(QFlags_conflict1 *)0x3);
  pQVar4 = (QWidget *)this->horizontalLayout_2;
  pQVar7 = this->groupBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_568);
  QBoxLayout::addWidget(pQVar4,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pTVar17 = (TargetImageWidget *)operator_new(0x78);
  TargetImageWidget::TargetImageWidget(pTVar17,this->loadImageTab);
  this->allRgbWidget = pTVar17;
  pTVar17 = this->allRgbWidget;
  QByteArrayView::QByteArrayView<13ul>((QByteArrayView *)auStack_590,(char (*) [13])"allRgbWidget");
  QVar49.m_data = _auStack_590;
  QVar49.m_size = (qsizetype)&local_580;
  QString::fromUtf8(QVar49);
  QObject::setObjectName((QString *)pTVar17);
  QString::~QString(&local_580);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_594.bits,Expanding,Expanding,DefaultType);
  QSizePolicy::setHorizontalStretch((QSizePolicy *)&local_594.bits,0);
  QSizePolicy::setVerticalStretch((QSizePolicy *)&local_594.bits,0);
  local_598.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_598.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_594.bits,bVar2);
  local_59c = local_594;
  QWidget::setSizePolicy((QSizePolicy *)this->allRgbWidget);
  pQVar4 = (QWidget *)this->horizontalLayout_2;
  pTVar17 = this->allRgbWidget;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_5a0);
  QBoxLayout::addWidget(pQVar4,(int)pTVar17,(QFlags_conflict1 *)0x0);
  pQVar4 = (QWidget *)this->tabWidget;
  pQVar12 = this->loadImageTab;
  QString::QString(&local_5b8);
  QTabWidget::addTab(pQVar4,(QString *)pQVar12);
  QString::~QString(&local_5b8);
  pQVar4 = (QWidget *)operator_new(0x28);
  QFlags<Qt::WindowType>::QFlags(&local_5bc);
  QWidget::QWidget(pQVar4,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_5bc.i);
  this->allRgbTab = pQVar4;
  pQVar4 = this->allRgbTab;
  QByteArrayView::QByteArrayView<10ul>(&local_5e8,(char (*) [10])"allRgbTab");
  QVar50.m_data = (storage_type *)local_5e8.m_size;
  QVar50.m_size = (qsizetype)&local_5d8;
  QString::fromUtf8(QVar50);
  QObject::setObjectName((QString *)pQVar4);
  QString::~QString(&local_5d8);
  pQVar5 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar5,this->allRgbTab);
  this->horizontalLayout_3 = pQVar5;
  pQVar5 = this->horizontalLayout_3;
  QByteArrayView::QByteArrayView<19ul>(&local_610,(char (*) [19])"horizontalLayout_3");
  QVar51.m_data = (storage_type *)local_610.m_size;
  QVar51.m_size = (qsizetype)&local_600;
  QString::fromUtf8(QVar51);
  QObject::setObjectName((QString *)pQVar5);
  QString::~QString(&local_600);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  QGroupBox::QGroupBox(pQVar7,this->allRgbTab);
  this->allRgbSettingsGroup = pQVar7;
  pQVar7 = this->allRgbSettingsGroup;
  QByteArrayView::QByteArrayView<20ul>(&local_638,(char (*) [20])"allRgbSettingsGroup");
  QVar52.m_data = (storage_type *)local_638.m_size;
  QVar52.m_size = (qsizetype)&local_628;
  QString::fromUtf8(QVar52);
  QObject::setObjectName((QString *)pQVar7);
  QString::~QString(&local_628);
  pQVar8 = (QGridLayout *)operator_new(0x20);
  QGridLayout::QGridLayout(pQVar8,(QWidget *)this->allRgbSettingsGroup);
  this->gridLayout_2 = pQVar8;
  pQVar8 = this->gridLayout_2;
  QByteArrayView::QByteArrayView<13ul>(&local_660,(char (*) [13])"gridLayout_2");
  QVar53.m_data = (storage_type *)local_660.m_size;
  QVar53.m_size = (qsizetype)&local_650;
  QString::fromUtf8(QVar53);
  QObject::setObjectName((QString *)pQVar8);
  QString::~QString(&local_650);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->allRgbSettingsGroup;
  QFlags<Qt::WindowType>::QFlags(&local_664);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_664.i);
  this->allRGBImprovementsValueLabel = pQVar9;
  pQVar9 = this->allRGBImprovementsValueLabel;
  QByteArrayView::QByteArrayView<29ul>(&local_690,(char (*) [29])"allRGBImprovementsValueLabel");
  QVar54.m_data = (storage_type *)local_690.m_size;
  QVar54.m_size = (qsizetype)&local_680;
  QString::fromUtf8(QVar54);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_680);
  pQVar9 = this->allRGBImprovementsValueLabel;
  local_698 = Qt::operator|(AlignRight,AlignRight);
  local_694 = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_698,AlignVCenter);
  QLabel::setAlignment((QFlags_conflict1 *)pQVar9);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar9 = this->allRGBImprovementsValueLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_69c);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,8,1,1,(QFlags_conflict1 *)0x1);
  pQVar10 = (QTextBrowser *)operator_new(0x28);
  QTextBrowser::QTextBrowser(pQVar10,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbSolverDetailsTextBrowser = pQVar10;
  pQVar10 = this->allRgbSolverDetailsTextBrowser;
  QByteArrayView::QByteArrayView<31ul>(&local_6c8,(char (*) [31])"allRgbSolverDetailsTextBrowser");
  QVar55.m_data = (storage_type *)local_6c8.m_size;
  QVar55.m_size = (qsizetype)&local_6b8;
  QString::fromUtf8(QVar55);
  QObject::setObjectName((QString *)pQVar10);
  QString::~QString(&local_6b8);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar10 = this->allRgbSolverDetailsTextBrowser;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_6cc);
  QGridLayout::addWidget(pQVar4,(int)pQVar10,5,0,1,(QFlags_conflict1 *)0x2);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbStartButton = pQVar11;
  pQVar11 = this->allRgbStartButton;
  QByteArrayView::QByteArrayView<18ul>(&local_6f8,(char (*) [18])"allRgbStartButton");
  QVar56.m_data = (storage_type *)local_6f8.m_size;
  QVar56.m_size = (qsizetype)&local_6e8;
  QString::fromUtf8(QVar56);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_6e8);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbStartButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_6fc);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,6,0,1,(QFlags_conflict1 *)0x1);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbSaveButton = pQVar11;
  pQVar11 = this->allRgbSaveButton;
  QByteArrayView::QByteArrayView<17ul>(&local_728,(char (*) [17])"allRgbSaveButton");
  QVar57.m_data = (storage_type *)local_728.m_size;
  QVar57.m_size = (qsizetype)&local_718;
  QString::fromUtf8(QVar57);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_718);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbSaveButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_72c);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,10,0,1,(QFlags_conflict1 *)0x2);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbStopButton = pQVar11;
  pQVar11 = this->allRgbStopButton;
  QByteArrayView::QByteArrayView<17ul>(&local_758,(char (*) [17])"allRgbStopButton");
  QVar58.m_data = (storage_type *)local_758.m_size;
  QVar58.m_size = (qsizetype)&local_748;
  QString::fromUtf8(QVar58);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_748);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbStopButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_75c);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,6,1,1,(QFlags_conflict1 *)0x1);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->allRgbSettingsGroup;
  QFlags<Qt::WindowType>::QFlags(&local_760);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_760.i);
  this->ImprovementsLabel = pQVar9;
  pQVar9 = this->ImprovementsLabel;
  QByteArrayView::QByteArrayView<18ul>(&local_788,(char (*) [18])"ImprovementsLabel");
  QVar59.m_data = (storage_type *)local_788.m_size;
  QVar59.m_size = (qsizetype)&local_778;
  QString::fromUtf8(QVar59);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_778);
  pQVar9 = this->ImprovementsLabel;
  local_790 = Qt::operator|(AlignRight,AlignRight);
  local_78c = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_790,AlignVCenter);
  QLabel::setAlignment((QFlags_conflict1 *)pQVar9);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar9 = this->ImprovementsLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_794);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,8,0,1,(QFlags_conflict1 *)0x1);
  pQVar16 = (QSpacerItem *)operator_new(0x28);
  QSpacerItem::QSpacerItem(pQVar16,0x14,0x28,Minimum,Expanding);
  this->allRgbOptionsSpacer = pQVar16;
  pQVar8 = this->gridLayout_2;
  pQVar16 = this->allRgbOptionsSpacer;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_798);
  QGridLayout::addItem((QLayoutItem *)pQVar8,(int)pQVar16,0xb,0,1,(QFlags_conflict1 *)0x2);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbLoadButton = pQVar11;
  pQVar11 = this->allRgbLoadButton;
  QByteArrayView::QByteArrayView<17ul>(&local_7c0,(char (*) [17])"allRgbLoadButton");
  QVar60.m_data = (storage_type *)local_7c0.m_size;
  QVar60.m_size = (qsizetype)&local_7b0;
  QString::fromUtf8(QVar60);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_7b0);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbLoadButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_7c4);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,1,0,1,(QFlags_conflict1 *)0x2);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbResetPixelsButton = pQVar11;
  pQVar11 = this->allRgbResetPixelsButton;
  QByteArrayView::QByteArrayView<24ul>(&local_7f0,(char (*) [24])"allRgbResetPixelsButton");
  QVar61.m_data = (storage_type *)local_7f0.m_size;
  QVar61.m_size = (qsizetype)&local_7e0;
  QString::fromUtf8(QVar61);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_7e0);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbResetPixelsButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_7f4);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,0,0,1,(QFlags_conflict1 *)0x2);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbResetViewButton = pQVar11;
  pQVar11 = this->allRgbResetViewButton;
  QByteArrayView::QByteArrayView<22ul>(&local_820,(char (*) [22])"allRgbResetViewButton");
  QVar62.m_data = (storage_type *)local_820.m_size;
  QVar62.m_size = (qsizetype)&local_810;
  QString::fromUtf8(QVar62);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_810);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbResetViewButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_824);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,2,0,1,(QFlags_conflict1 *)0x2);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->allRgbSettingsGroup;
  QFlags<Qt::WindowType>::QFlags(&local_828);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_828.i);
  this->allRgbOverlayLabel = pQVar9;
  pQVar9 = this->allRgbOverlayLabel;
  QByteArrayView::QByteArrayView<19ul>(&local_850,(char (*) [19])"allRgbOverlayLabel");
  QVar63.m_data = (storage_type *)local_850.m_size;
  QVar63.m_size = (qsizetype)&local_840;
  QString::fromUtf8(QVar63);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_840);
  pQVar9 = this->allRgbOverlayLabel;
  local_858 = Qt::operator|(AlignRight,AlignRight);
  local_854 = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_858,AlignVCenter);
  QLabel::setAlignment((QFlags_conflict1 *)pQVar9);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar9 = this->allRgbOverlayLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_85c);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,4,0,1,(QFlags_conflict1 *)0x1);
  pQVar18 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar18,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbSolverComboBox = pQVar18;
  pQVar18 = this->allRgbSolverComboBox;
  QByteArrayView::QByteArrayView<21ul>(&local_888,(char (*) [21])"allRgbSolverComboBox");
  QVar64.m_data = (storage_type *)local_888.m_size;
  QVar64.m_size = (qsizetype)&local_878;
  QString::fromUtf8(QVar64);
  QObject::setObjectName((QString *)pQVar18);
  QString::~QString(&local_878);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar18 = this->allRgbSolverComboBox;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_88c);
  QGridLayout::addWidget(pQVar4,(int)pQVar18,4,1,1,(QFlags_conflict1 *)0x1);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbUpdateTargetButton = pQVar11;
  pQVar11 = this->allRgbUpdateTargetButton;
  QByteArrayView::QByteArrayView<25ul>(&local_8b8,(char (*) [25])"allRgbUpdateTargetButton");
  QVar65.m_data = (storage_type *)local_8b8.m_size;
  QVar65.m_size = (qsizetype)&local_8a8;
  QString::fromUtf8(QVar65);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_8a8);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbUpdateTargetButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_8bc);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,3,0,1,(QFlags_conflict1 *)0x2);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->allRgbSettingsGroup;
  QFlags<Qt::WindowType>::QFlags(&local_8c0);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_8c0.i);
  this->allRGBIterationLabel = pQVar9;
  pQVar9 = this->allRGBIterationLabel;
  QByteArrayView::QByteArrayView<21ul>(&local_8e8,(char (*) [21])"allRGBIterationLabel");
  QVar66.m_data = (storage_type *)local_8e8.m_size;
  QVar66.m_size = (qsizetype)&local_8d8;
  QString::fromUtf8(QVar66);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_8d8);
  pQVar9 = this->allRGBIterationLabel;
  local_8f0 = Qt::operator|(AlignRight,AlignRight);
  local_8ec = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_8f0,AlignVCenter);
  QLabel::setAlignment((QFlags_conflict1 *)pQVar9);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar9 = this->allRGBIterationLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_8f4);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,7,0,1,(QFlags_conflict1 *)0x1);
  pQVar11 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar11,(QWidget *)this->allRgbSettingsGroup);
  this->allRgbPreviewButton = pQVar11;
  pQVar11 = this->allRgbPreviewButton;
  QByteArrayView::QByteArrayView<20ul>(&local_920,(char (*) [20])"allRgbPreviewButton");
  QVar67.m_data = (storage_type *)local_920.m_size;
  QVar67.m_size = (qsizetype)&local_910;
  QString::fromUtf8(QVar67);
  QObject::setObjectName((QString *)pQVar11);
  QString::~QString(&local_910);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar11 = this->allRgbPreviewButton;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_924);
  QGridLayout::addWidget(pQVar4,(int)pQVar11,9,0,1,(QFlags_conflict1 *)0x2);
  pQVar9 = (QLabel *)operator_new(0x28);
  pQVar4 = (QWidget *)this->allRgbSettingsGroup;
  QFlags<Qt::WindowType>::QFlags(&local_928);
  QLabel::QLabel(pQVar9,pQVar4,(QFlags_conflict1 *)(ulong)local_928.i);
  this->allRGBIterationsValueLabel = pQVar9;
  pQVar9 = this->allRGBIterationsValueLabel;
  QByteArrayView::QByteArrayView<27ul>(&local_950,(char (*) [27])"allRGBIterationsValueLabel");
  QVar68.m_data = (storage_type *)local_950.m_size;
  QVar68.m_size = (qsizetype)&local_940;
  QString::fromUtf8(QVar68);
  QObject::setObjectName((QString *)pQVar9);
  QString::~QString(&local_940);
  pQVar9 = this->allRGBIterationsValueLabel;
  local_958 = Qt::operator|(AlignRight,AlignRight);
  local_954 = (Int)QFlags<Qt::AlignmentFlag>::operator|(&local_958,AlignVCenter);
  QLabel::setAlignment((QFlags_conflict1 *)pQVar9);
  pQVar4 = (QWidget *)this->gridLayout_2;
  pQVar9 = this->allRGBIterationsValueLabel;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_95c);
  QGridLayout::addWidget(pQVar4,(int)pQVar9,7,1,1,(QFlags_conflict1 *)0x1);
  pQVar4 = (QWidget *)this->horizontalLayout_3;
  pQVar7 = this->allRgbSettingsGroup;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_960);
  QBoxLayout::addWidget(pQVar4,(int)pQVar7,(QFlags_conflict1 *)0x0);
  pAVar19 = (AllRgbWidget *)operator_new(0xc0);
  AllRgbWidget::AllRgbWidget(pAVar19,this->allRgbTab);
  this->allRgbPreviewWidget = pAVar19;
  pAVar19 = this->allRgbPreviewWidget;
  QByteArrayView::QByteArrayView<20ul>(&local_988,(char (*) [20])"allRgbPreviewWidget");
  QVar69.m_data = (storage_type *)local_988.m_size;
  QVar69.m_size = (qsizetype)&local_978;
  QString::fromUtf8(QVar69);
  QObject::setObjectName((QString *)pAVar19);
  QString::~QString(&local_978);
  local_98c.data = QWidget::sizePolicy();
  bVar2 = QSizePolicy::hasHeightForWidth((QSizePolicy *)&local_98c.bits);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_594.bits,bVar2);
  local_990 = local_594;
  QWidget::setSizePolicy((QSizePolicy *)this->allRgbPreviewWidget);
  pQVar4 = (QWidget *)this->horizontalLayout_3;
  pAVar19 = this->allRgbPreviewWidget;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_994);
  QBoxLayout::addWidget(pQVar4,(int)pAVar19,(QFlags_conflict1 *)0x0);
  pQVar4 = (QWidget *)this->tabWidget;
  pQVar12 = this->allRgbTab;
  QString::QString(&local_9b0);
  QTabWidget::addTab(pQVar4,(QString *)pQVar12);
  QString::~QString(&local_9b0);
  pQVar4 = (QWidget *)this->horizontalLayout;
  pQVar6 = this->tabWidget;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_9b4);
  QBoxLayout::addWidget(pQVar4,(int)pQVar6,(QFlags_conflict1 *)0x0);
  QMainWindow::setCentralWidget((QWidget *)local_18);
  retranslateUi(this,local_18);
  QTabWidget::setCurrentIndex((int)this->tabWidget);
  QMetaObject::connectSlotsByName((QObject *)local_18);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(1202, 792);
        actionNew = new QAction(MainWindow);
        actionNew->setObjectName(QString::fromUtf8("actionNew"));
        actionLoad = new QAction(MainWindow);
        actionLoad->setObjectName(QString::fromUtf8("actionLoad"));
        actionSave = new QAction(MainWindow);
        actionSave->setObjectName(QString::fromUtf8("actionSave"));
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        horizontalLayout = new QHBoxLayout(centralwidget);
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        tabWidget = new QTabWidget(centralwidget);
        tabWidget->setObjectName(QString::fromUtf8("tabWidget"));
        loadImageTab = new QWidget();
        loadImageTab->setObjectName(QString::fromUtf8("loadImageTab"));
        horizontalLayout_2 = new QHBoxLayout(loadImageTab);
        horizontalLayout_2->setObjectName(QString::fromUtf8("horizontalLayout_2"));
        groupBox = new QGroupBox(loadImageTab);
        groupBox->setObjectName(QString::fromUtf8("groupBox"));
        gridLayout = new QGridLayout(groupBox);
        gridLayout->setObjectName(QString::fromUtf8("gridLayout"));
        targetImageScaleLabel = new QLabel(groupBox);
        targetImageScaleLabel->setObjectName(QString::fromUtf8("targetImageScaleLabel"));

        gridLayout->addWidget(targetImageScaleLabel, 3, 0, 1, 1);

        explanationText = new QTextBrowser(groupBox);
        explanationText->setObjectName(QString::fromUtf8("explanationText"));

        gridLayout->addWidget(explanationText, 0, 0, 1, 3);

        targetImageRotate90DegreesButton = new QPushButton(groupBox);
        targetImageRotate90DegreesButton->setObjectName(QString::fromUtf8("targetImageRotate90DegreesButton"));

        gridLayout->addWidget(targetImageRotate90DegreesButton, 2, 2, 1, 1);

        targetImageLoadButton = new QPushButton(groupBox);
        targetImageLoadButton->setObjectName(QString::fromUtf8("targetImageLoadButton"));

        gridLayout->addWidget(targetImageLoadButton, 1, 0, 1, 3);

        widget = new QWidget(groupBox);
        widget->setObjectName(QString::fromUtf8("widget"));
        verticalLayout = new QVBoxLayout(widget);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        verticalLayout->setContentsMargins(0, 0, 0, 0);
        targetImageXOffsetSpinBox = new QDoubleSpinBox(widget);
        targetImageXOffsetSpinBox->setObjectName(QString::fromUtf8("targetImageXOffsetSpinBox"));
        targetImageXOffsetSpinBox->setMinimum(-4096.000000000000000);
        targetImageXOffsetSpinBox->setMaximum(4096.000000000000000);

        verticalLayout->addWidget(targetImageXOffsetSpinBox);

        targetImageYOffsetSpinBox = new QDoubleSpinBox(widget);
        targetImageYOffsetSpinBox->setObjectName(QString::fromUtf8("targetImageYOffsetSpinBox"));
        targetImageYOffsetSpinBox->setMinimum(-4096.000000000000000);
        targetImageYOffsetSpinBox->setMaximum(4096.000000000000000);

        verticalLayout->addWidget(targetImageYOffsetSpinBox);


        gridLayout->addWidget(widget, 4, 1, 2, 1);

        targetImageScaleSpinBox = new QDoubleSpinBox(groupBox);
        targetImageScaleSpinBox->setObjectName(QString::fromUtf8("targetImageScaleSpinBox"));
        targetImageScaleSpinBox->setDecimals(2);
        targetImageScaleSpinBox->setMinimum(0.010000000000000);
        targetImageScaleSpinBox->setMaximum(10.000000000000000);
        targetImageScaleSpinBox->setSingleStep(1.000000000000000);
        targetImageScaleSpinBox->setStepType(QAbstractSpinBox::AdaptiveDecimalStepType);
        targetImageScaleSpinBox->setValue(1.000000000000000);

        gridLayout->addWidget(targetImageScaleSpinBox, 3, 1, 1, 1);

        targetImageOffsetLabel = new QLabel(groupBox);
        targetImageOffsetLabel->setObjectName(QString::fromUtf8("targetImageOffsetLabel"));

        gridLayout->addWidget(targetImageOffsetLabel, 4, 0, 2, 1);

        targetImageRotationLabel = new QLabel(groupBox);
        targetImageRotationLabel->setObjectName(QString::fromUtf8("targetImageRotationLabel"));

        gridLayout->addWidget(targetImageRotationLabel, 2, 0, 1, 1);

        targetImageRotationSlider = new QSlider(groupBox);
        targetImageRotationSlider->setObjectName(QString::fromUtf8("targetImageRotationSlider"));
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(targetImageRotationSlider->sizePolicy().hasHeightForWidth());
        targetImageRotationSlider->setSizePolicy(sizePolicy);
        targetImageRotationSlider->setMaximum(359);
        targetImageRotationSlider->setOrientation(Qt::Horizontal);

        gridLayout->addWidget(targetImageRotationSlider, 2, 1, 1, 1);

        targetImagePreviewButton = new QPushButton(groupBox);
        targetImagePreviewButton->setObjectName(QString::fromUtf8("targetImagePreviewButton"));

        gridLayout->addWidget(targetImagePreviewButton, 6, 0, 1, 3);

        targetImageResetTranslationButton = new QPushButton(groupBox);
        targetImageResetTranslationButton->setObjectName(QString::fromUtf8("targetImageResetTranslationButton"));

        gridLayout->addWidget(targetImageResetTranslationButton, 4, 2, 2, 1);

        setTargetImageButton = new QPushButton(groupBox);
        setTargetImageButton->setObjectName(QString::fromUtf8("setTargetImageButton"));

        gridLayout->addWidget(setTargetImageButton, 8, 0, 1, 3);

        moreByTroyDevButton = new QPushButton(groupBox);
        moreByTroyDevButton->setObjectName(QString::fromUtf8("moreByTroyDevButton"));

        gridLayout->addWidget(moreByTroyDevButton, 10, 0, 1, 3);

        targetImageFitToAreaButton = new QPushButton(groupBox);
        targetImageFitToAreaButton->setObjectName(QString::fromUtf8("targetImageFitToAreaButton"));

        gridLayout->addWidget(targetImageFitToAreaButton, 3, 2, 1, 1);

        targetImageOptionsSpacer = new QSpacerItem(20, 40, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout->addItem(targetImageOptionsSpacer, 9, 0, 1, 3);

        targetImageSaveButton = new QPushButton(groupBox);
        targetImageSaveButton->setObjectName(QString::fromUtf8("targetImageSaveButton"));

        gridLayout->addWidget(targetImageSaveButton, 7, 0, 1, 3);


        horizontalLayout_2->addWidget(groupBox);

        allRgbWidget = new TargetImageWidget(loadImageTab);
        allRgbWidget->setObjectName(QString::fromUtf8("allRgbWidget"));
        QSizePolicy sizePolicy1(QSizePolicy::Expanding, QSizePolicy::Expanding);
        sizePolicy1.setHorizontalStretch(0);
        sizePolicy1.setVerticalStretch(0);
        sizePolicy1.setHeightForWidth(allRgbWidget->sizePolicy().hasHeightForWidth());
        allRgbWidget->setSizePolicy(sizePolicy1);

        horizontalLayout_2->addWidget(allRgbWidget);

        tabWidget->addTab(loadImageTab, QString());
        allRgbTab = new QWidget();
        allRgbTab->setObjectName(QString::fromUtf8("allRgbTab"));
        horizontalLayout_3 = new QHBoxLayout(allRgbTab);
        horizontalLayout_3->setObjectName(QString::fromUtf8("horizontalLayout_3"));
        allRgbSettingsGroup = new QGroupBox(allRgbTab);
        allRgbSettingsGroup->setObjectName(QString::fromUtf8("allRgbSettingsGroup"));
        gridLayout_2 = new QGridLayout(allRgbSettingsGroup);
        gridLayout_2->setObjectName(QString::fromUtf8("gridLayout_2"));
        allRGBImprovementsValueLabel = new QLabel(allRgbSettingsGroup);
        allRGBImprovementsValueLabel->setObjectName(QString::fromUtf8("allRGBImprovementsValueLabel"));
        allRGBImprovementsValueLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRGBImprovementsValueLabel, 8, 1, 1, 1);

        allRgbSolverDetailsTextBrowser = new QTextBrowser(allRgbSettingsGroup);
        allRgbSolverDetailsTextBrowser->setObjectName(QString::fromUtf8("allRgbSolverDetailsTextBrowser"));

        gridLayout_2->addWidget(allRgbSolverDetailsTextBrowser, 5, 0, 1, 2);

        allRgbStartButton = new QPushButton(allRgbSettingsGroup);
        allRgbStartButton->setObjectName(QString::fromUtf8("allRgbStartButton"));

        gridLayout_2->addWidget(allRgbStartButton, 6, 0, 1, 1);

        allRgbSaveButton = new QPushButton(allRgbSettingsGroup);
        allRgbSaveButton->setObjectName(QString::fromUtf8("allRgbSaveButton"));

        gridLayout_2->addWidget(allRgbSaveButton, 10, 0, 1, 2);

        allRgbStopButton = new QPushButton(allRgbSettingsGroup);
        allRgbStopButton->setObjectName(QString::fromUtf8("allRgbStopButton"));

        gridLayout_2->addWidget(allRgbStopButton, 6, 1, 1, 1);

        ImprovementsLabel = new QLabel(allRgbSettingsGroup);
        ImprovementsLabel->setObjectName(QString::fromUtf8("ImprovementsLabel"));
        ImprovementsLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(ImprovementsLabel, 8, 0, 1, 1);

        allRgbOptionsSpacer = new QSpacerItem(20, 40, QSizePolicy::Minimum, QSizePolicy::Expanding);

        gridLayout_2->addItem(allRgbOptionsSpacer, 11, 0, 1, 2);

        allRgbLoadButton = new QPushButton(allRgbSettingsGroup);
        allRgbLoadButton->setObjectName(QString::fromUtf8("allRgbLoadButton"));

        gridLayout_2->addWidget(allRgbLoadButton, 1, 0, 1, 2);

        allRgbResetPixelsButton = new QPushButton(allRgbSettingsGroup);
        allRgbResetPixelsButton->setObjectName(QString::fromUtf8("allRgbResetPixelsButton"));

        gridLayout_2->addWidget(allRgbResetPixelsButton, 0, 0, 1, 2);

        allRgbResetViewButton = new QPushButton(allRgbSettingsGroup);
        allRgbResetViewButton->setObjectName(QString::fromUtf8("allRgbResetViewButton"));

        gridLayout_2->addWidget(allRgbResetViewButton, 2, 0, 1, 2);

        allRgbOverlayLabel = new QLabel(allRgbSettingsGroup);
        allRgbOverlayLabel->setObjectName(QString::fromUtf8("allRgbOverlayLabel"));
        allRgbOverlayLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRgbOverlayLabel, 4, 0, 1, 1);

        allRgbSolverComboBox = new QComboBox(allRgbSettingsGroup);
        allRgbSolverComboBox->setObjectName(QString::fromUtf8("allRgbSolverComboBox"));

        gridLayout_2->addWidget(allRgbSolverComboBox, 4, 1, 1, 1);

        allRgbUpdateTargetButton = new QPushButton(allRgbSettingsGroup);
        allRgbUpdateTargetButton->setObjectName(QString::fromUtf8("allRgbUpdateTargetButton"));

        gridLayout_2->addWidget(allRgbUpdateTargetButton, 3, 0, 1, 2);

        allRGBIterationLabel = new QLabel(allRgbSettingsGroup);
        allRGBIterationLabel->setObjectName(QString::fromUtf8("allRGBIterationLabel"));
        allRGBIterationLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRGBIterationLabel, 7, 0, 1, 1);

        allRgbPreviewButton = new QPushButton(allRgbSettingsGroup);
        allRgbPreviewButton->setObjectName(QString::fromUtf8("allRgbPreviewButton"));

        gridLayout_2->addWidget(allRgbPreviewButton, 9, 0, 1, 2);

        allRGBIterationsValueLabel = new QLabel(allRgbSettingsGroup);
        allRGBIterationsValueLabel->setObjectName(QString::fromUtf8("allRGBIterationsValueLabel"));
        allRGBIterationsValueLabel->setAlignment(Qt::AlignRight|Qt::AlignTrailing|Qt::AlignVCenter);

        gridLayout_2->addWidget(allRGBIterationsValueLabel, 7, 1, 1, 1);


        horizontalLayout_3->addWidget(allRgbSettingsGroup);

        allRgbPreviewWidget = new AllRgbWidget(allRgbTab);
        allRgbPreviewWidget->setObjectName(QString::fromUtf8("allRgbPreviewWidget"));
        sizePolicy1.setHeightForWidth(allRgbPreviewWidget->sizePolicy().hasHeightForWidth());
        allRgbPreviewWidget->setSizePolicy(sizePolicy1);

        horizontalLayout_3->addWidget(allRgbPreviewWidget);

        tabWidget->addTab(allRgbTab, QString());

        horizontalLayout->addWidget(tabWidget);

        MainWindow->setCentralWidget(centralwidget);

        retranslateUi(MainWindow);

        tabWidget->setCurrentIndex(0);


        QMetaObject::connectSlotsByName(MainWindow);
    }